

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>::~Array
          (Array<const_kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }